

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O3

int32_t __thiscall
icu_63::CollationDataBuilder::addCE(CollationDataBuilder *this,int64_t ce,UErrorCode *errorCode)

{
  int iVar1;
  UBool UVar2;
  int iVar3;
  long lVar4;
  
  iVar1 = (this->ce64s).count;
  if (0 < (long)iVar1) {
    lVar4 = 0;
    do {
      if ((this->ce64s).elements[lVar4] == ce) {
        return (int32_t)lVar4;
      }
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  if ((iVar1 < -1) || (iVar3 = iVar1, (this->ce64s).capacity <= iVar1)) {
    UVar2 = UVector64::expandCapacity(&this->ce64s,iVar1 + 1,errorCode);
    if (UVar2 == '\0') {
      return iVar1;
    }
    iVar3 = (this->ce64s).count;
  }
  (this->ce64s).elements[iVar3] = ce;
  (this->ce64s).count = iVar3 + 1;
  return iVar1;
}

Assistant:

int32_t
CollationDataBuilder::addCE(int64_t ce, UErrorCode &errorCode) {
    int32_t length = ce64s.size();
    for(int32_t i = 0; i < length; ++i) {
        if(ce == ce64s.elementAti(i)) { return i; }
    }
    ce64s.addElement(ce, errorCode);
    return length;
}